

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fVertexTextureTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles2::Functional::Vertex2DTextureCase::iterate(Vertex2DTextureCase *this)

{
  undefined4 uVar1;
  undefined4 uVar4;
  undefined8 uVar2;
  undefined8 uVar3;
  GLuint program;
  Texture2D *pTVar5;
  RenderContext *context;
  undefined4 uVar6;
  float fVar7;
  bool bVar8;
  deUint32 dVar9;
  float fVar10;
  GLuint GVar11;
  GLint GVar12;
  RenderTarget *pRVar13;
  long lVar14;
  unsigned_short uVar15;
  long lVar16;
  char *description;
  unsigned_short uVar17;
  int i;
  int iVar18;
  long lVar19;
  ulong uVar20;
  int iVar21;
  iterator iVar22;
  void *data;
  int i_1;
  bool bVar23;
  ulong uVar24;
  float *pfVar25;
  int iVar26;
  int iVar27;
  RGBA *pRVar28;
  unsigned_short uVar29;
  uint uVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  Vector<float,_2> res;
  Surface resImage;
  Vec4 color;
  Vec2 quadVertices [4];
  Surface refImage;
  Random rnd;
  int local_248;
  RGBA local_234;
  ulong local_230;
  float local_228;
  float local_224;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_220;
  undefined1 local_208 [8];
  ArrayBuffer<unsigned_int,_4UL,_4UL> local_200;
  undefined1 local_1f0 [8];
  undefined1 auStack_1e8 [16];
  size_t sStack_1d8;
  ArrayBuffer<unsigned_int,_4UL,_4UL> local_1d0;
  unsigned_short *local_1c0;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  ulong local_1a8;
  uint local_1a0;
  uint local_19c;
  float local_198;
  ulong local_180;
  int local_178;
  int local_174;
  int local_170;
  float local_16c;
  float local_168;
  float local_164;
  undefined1 local_160 [24];
  undefined1 local_148 [28];
  float local_12c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [36];
  int local_d4;
  undefined4 local_d0;
  float local_cc;
  int local_c8;
  undefined4 local_c4;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined4 local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  undefined4 local_a0;
  undefined8 local_9c;
  undefined8 uStack_94;
  int local_8c;
  int local_88;
  float local_84;
  int local_80;
  undefined4 local_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  long local_68;
  long local_60;
  Surface local_58;
  deRandom local_40;
  
  pRVar13 = Context::getRenderTarget((this->super_TestCase).m_context);
  uVar24 = (ulong)(uint)pRVar13->m_width;
  if (0xff < pRVar13->m_width) {
    uVar24 = 0x100;
  }
  pRVar13 = Context::getRenderTarget((this->super_TestCase).m_context);
  local_178 = 0x100;
  if (pRVar13->m_height < 0x100) {
    local_178 = pRVar13->m_height;
  }
  pRVar13 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar18 = pRVar13->m_width;
  pRVar13 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar21 = pRVar13->m_height;
  dVar9 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deRandom_init(&local_40,dVar9);
  dVar9 = deRandom_getUint32(&local_40);
  iVar27 = (int)uVar24;
  local_19c = dVar9 % ((iVar18 - iVar27) + 1U);
  dVar9 = deRandom_getUint32(&local_40);
  local_1a0 = dVar9 % ((iVar21 - local_178) + 1U);
  glwUseProgram((this->m_program->m_program).m_program);
  iVar18 = (int)(uVar24 >> 0x1f) + iVar27 >> 1;
  local_1b8 = (float)(iVar27 - iVar18);
  iVar26 = local_178 / 2;
  iVar21 = local_178 - iVar26;
  glwClearColor(0.125,0.25,0.5,1.0);
  glwClear(0x4000);
  local_174 = iVar27;
  tcu::Surface::Surface(&local_58,iVar27,local_178);
  local_f8._0_4_ = R;
  local_f8._4_4_ = SNORM_INT8;
  local_f8._8_4_ = iVar18;
  local_f8._12_4_ = iVar26;
  local_f8._16_4_ = 0;
  local_f8._20_4_ = 0x3fe66666;
  local_f8._24_4_ = 0x3fe66666;
  local_f8._28_8_ = 0xbe4ccccdbe99999a;
  local_d4 = iVar18;
  local_d0 = 0;
  local_cc = local_1b8;
  local_c8 = iVar26;
  local_c4 = 0;
  local_c0 = 0x3e99999a3e99999a;
  uStack_b8 = 0x3f4ccccd3f666666;
  local_b0 = 0;
  local_ac = iVar26;
  local_a8 = iVar18;
  local_a4 = iVar21;
  local_a0 = 1;
  local_9c = 0x3fe666663fe66666;
  uStack_94 = 0xbe4ccccdbe99999a;
  local_8c = iVar18;
  local_88 = iVar26;
  local_84 = local_1b8;
  local_80 = iVar21;
  local_7c = 1;
  local_78 = 0x3e99999a3e99999a;
  uStack_70 = 0x3f4ccccd3f666666;
  lVar19 = 0;
  local_160._16_8_ = this;
  do {
    local_68 = lVar19;
    auVar37._0_4_ = (float)(int)*(undefined8 *)(local_f8 + lVar19 * 0x24 + 8);
    auVar37._4_4_ = (float)(int)((ulong)*(undefined8 *)(local_f8 + lVar19 * 0x24 + 8) >> 0x20);
    auVar37._8_8_ = 0;
    uVar1 = (this->m_textures[*(int *)(local_f8 + lVar19 * 0x24 + 0x10)]->m_refTexture).m_width;
    uVar4 = (this->m_textures[*(int *)(local_f8 + lVar19 * 0x24 + 0x10)]->m_refTexture).m_height;
    auVar36._0_4_ = (float)*(undefined8 *)(local_f8 + lVar19 * 0x24 + 0x14) * (float)(int)uVar1;
    auVar36._4_4_ =
         (float)((ulong)*(undefined8 *)(local_f8 + lVar19 * 0x24 + 0x14) >> 0x20) *
         (float)(int)uVar4;
    auVar36._8_8_ = 0;
    auVar37 = divps(auVar36,auVar37);
    uVar30 = -(uint)(auVar37._4_4_ <= auVar37._0_4_);
    fVar31 = logf((float)(~uVar30 & (uint)auVar37._4_4_ | (uint)auVar37._0_4_ & uVar30));
    fVar31 = fVar31 * 1.442695;
    local_170 = *(int *)((long)this->m_textures + (ulong)(fVar31 <= 0.0) * 4 + -0x18);
    iVar18 = *(int *)(local_f8 + lVar19 * 0x24 + 8);
    iVar21 = *(int *)(local_f8 + lVar19 * 0x24 + 0xc);
    local_224 = (float)(this->m_textures[*(int *)(local_f8 + lVar19 * 0x24 + 0x10)]->m_refTexture).
                       m_width;
    local_180 = CONCAT44(local_180._4_4_,
                         (this->m_textures[*(int *)(local_f8 + lVar19 * 0x24 + 0x10)]->m_refTexture)
                         .m_height);
    local_228 = *(float *)(local_f8 + lVar19 * 0x24 + 0x14);
    local_168 = *(float *)(local_f8 + lVar19 * 0x24 + 0x18);
    local_164 = *(float *)(local_f8 + lVar19 * 0x24 + 0x1c);
    local_60 = lVar19 * 9;
    local_16c = *(float *)(local_f8 + lVar19 * 0x24 + 0x20);
    local_208._0_4_ = 0x7f;
    local_200 = (ArrayBuffer<unsigned_int,_4UL,_4UL>)ZEXT416(0);
    local_1c0 = (unsigned_short *)0x0;
    _local_1f0 = local_200;
    unique0x10001cbb = local_200;
    local_1d0 = local_200;
    std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::reserve
              ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
               (local_208 + 8),0xfc04);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::reserve
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_1d0,
               (long)(local_208._0_4_ * local_208._0_4_ * 6));
    uVar30 = local_208._0_4_;
    if (0 < (int)local_208._0_4_) {
      fVar32 = 0.0;
      do {
        if ((int)uVar30 < 1) {
          fVar32 = (float)((int)fVar32 + 1);
        }
        else {
          fVar35 = (float)(int)fVar32;
          local_108 = (float)((int)fVar32 + 1);
          local_230 = CONCAT44(local_230._4_4_,(float)(int)local_108 / 127.0);
          iVar27 = 0;
          do {
            fVar32 = (float)iVar27;
            iVar27 = iVar27 + 1;
            local_148._4_4_ = fVar35 / 127.0;
            local_148._0_4_ = fVar32 / 127.0;
            local_148._8_4_ = (float)iVar27 / 127.0;
            local_148._12_4_ = fVar35 / 127.0;
            local_148._16_4_ = fVar32 / 127.0;
            local_148._20_4_ = (float)local_230;
            local_148._24_4_ = (float)iVar27 / 127.0;
            local_12c = (float)local_230;
            local_1a8 = (ulong)((uint)((int)local_200.m_cap - (int)local_200.m_ptr) >> 3);
            lVar19 = 0;
            do {
              local_160._0_4_ = 0.0;
              local_234.m_value = 0;
              lVar14 = 0;
              pRVar28 = (RGBA *)local_160;
              iVar26 = iVar18;
              bVar8 = true;
              do {
                bVar23 = bVar8;
                local_1b8 = (float)iVar26;
                local_198 = *(float *)(local_148 + lVar14 * 4 + lVar19 * 8) * local_1b8 + 0.5;
                fVar32 = floorf(local_198);
                pRVar28->m_value =
                     (deUint32)(((local_198 - fVar32) * 0.5 + fVar32 + 0.25 + -0.5) / local_1b8);
                lVar14 = 1;
                pRVar28 = &local_234;
                iVar26 = iVar21;
                bVar8 = false;
              } while (bVar23);
              local_220.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   (pointer)CONCAT44((float)local_234.m_value + (float)local_234.m_value + -1.0,
                                     (float)local_160._0_4_ + (float)local_160._0_4_ + -1.0);
              std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
              emplace_back<tcu::Vector<float,2>>
                        ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)
                         (local_208 + 8),(Vector<float,_2> *)&local_220);
              lVar19 = lVar19 + 1;
            } while (lVar19 != 4);
            uVar29 = (unsigned_short)local_1a8;
            if ((unsigned_short *)local_1d0.m_cap == local_1c0) {
              local_220.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start._0_2_ = uVar29;
              std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
              _M_realloc_insert<unsigned_short>
                        ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_1d0,
                         (iterator)local_1d0.m_cap,(unsigned_short *)&local_220);
              iVar22._M_current = (unsigned_short *)local_1d0.m_cap;
            }
            else {
              *(unsigned_short *)local_1d0.m_cap = uVar29;
              iVar22._M_current = (unsigned_short *)(local_1d0.m_cap + 2);
              local_1d0.m_cap = (size_t)iVar22._M_current;
            }
            uVar17 = uVar29 + 1;
            if (iVar22._M_current == local_1c0) {
              local_220.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start._0_2_ = uVar17;
              std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
              _M_realloc_insert<unsigned_short>
                        ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_1d0,
                         iVar22,(unsigned_short *)&local_220);
              iVar22._M_current = (unsigned_short *)local_1d0.m_cap;
            }
            else {
              *iVar22._M_current = uVar17;
              local_1d0.m_cap = (size_t)(iVar22._M_current + 1);
              iVar22._M_current = iVar22._M_current + 1;
            }
            uVar15 = uVar29 + 2;
            if (iVar22._M_current == local_1c0) {
              local_220.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start._0_2_ = uVar15;
              std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
              _M_realloc_insert<unsigned_short>
                        ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_1d0,
                         iVar22,(unsigned_short *)&local_220);
              iVar22._M_current = (unsigned_short *)local_1d0.m_cap;
            }
            else {
              *iVar22._M_current = uVar15;
              local_1d0.m_cap = (size_t)(iVar22._M_current + 1);
              iVar22._M_current = iVar22._M_current + 1;
            }
            if (iVar22._M_current == local_1c0) {
              local_220.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start._0_2_ = uVar17;
              std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
              _M_realloc_insert<unsigned_short>
                        ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_1d0,
                         iVar22,(unsigned_short *)&local_220);
              iVar22._M_current = (unsigned_short *)local_1d0.m_cap;
            }
            else {
              *iVar22._M_current = uVar17;
              local_1d0.m_cap = (size_t)(iVar22._M_current + 1);
              iVar22._M_current = iVar22._M_current + 1;
            }
            fVar32 = local_108;
            local_220.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start._0_2_ = uVar29 + 3;
            if (iVar22._M_current == local_1c0) {
              std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
              _M_realloc_insert<unsigned_short>
                        ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_1d0,
                         iVar22,(unsigned_short *)&local_220);
              iVar22._M_current = (unsigned_short *)local_1d0.m_cap;
            }
            else {
              *iVar22._M_current =
                   (unsigned_short)
                   local_220.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              local_1d0.m_cap = (size_t)(iVar22._M_current + 1);
              iVar22._M_current = iVar22._M_current + 1;
            }
            local_220.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 (pointer)CONCAT62(local_220.
                                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start._2_6_,uVar15);
            if (iVar22._M_current == local_1c0) {
              std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
              _M_realloc_insert<unsigned_short>
                        ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_1d0,
                         iVar22,(unsigned_short *)&local_220);
            }
            else {
              *iVar22._M_current = uVar15;
              local_1d0.m_cap = (size_t)(iVar22._M_current + 1);
            }
            uVar30 = local_208._0_4_;
          } while (iVar27 < (int)local_208._0_4_);
        }
      } while ((int)fVar32 < (int)uVar30);
    }
    std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::reserve
              ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
               (local_1f0 + 8),(long)(int)(uVar30 * uVar30 * 4));
    iVar18 = local_170;
    if (0 < (int)local_208._0_4_) {
      fVar32 = (float)(int)local_208._0_4_;
      local_230 = local_230 & 0xffffffff00000000;
      uVar30 = local_208._0_4_;
      do {
        if (0 < (int)uVar30) {
          fVar35 = ((float)(int)(float)local_230 / fVar32) * local_168 + local_16c;
          iVar21 = 0;
          do {
            local_1a8 = CONCAT44(local_1a8._4_4_,iVar21);
            fVar33 = ((float)iVar21 / fVar32) * local_228 + local_164;
            iVar21 = 0;
            do {
              if (((iVar18 == 0x2600) || (iVar18 == 0x2702)) || (iVar18 == 0x2700)) {
                local_148._0_4_ = R;
                local_148._4_4_ = SNORM_INT8;
                fVar7 = (float)local_180;
                pfVar25 = (float *)local_148;
                fVar10 = local_224;
                bVar8 = true;
                fVar34 = fVar33;
                do {
                  bVar23 = bVar8;
                  local_1b8 = (float)(int)fVar10;
                  local_198 = fVar34 * local_1b8 + 0.5 + -0.5;
                  fVar34 = floorf(local_198);
                  *pfVar25 = ((local_198 - fVar34) * 0.5 + fVar34 + 0.25 + -0.5 + 0.5) / local_1b8;
                  pfVar25 = (float *)(local_148 + 4);
                  fVar10 = fVar7;
                  bVar8 = false;
                  fVar34 = fVar35;
                } while (bVar23);
              }
              else {
                local_148._4_4_ = fVar35;
                local_148._0_4_ = fVar33;
              }
              std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
              emplace_back<tcu::Vector<float,2>>
                        ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)
                         (local_1f0 + 8),(Vector<float,_2> *)local_148);
              iVar21 = iVar21 + 1;
            } while (iVar21 != 4);
            iVar21 = (int)(float)local_1a8 + 1;
            uVar30 = local_208._0_4_;
          } while (iVar21 < (int)local_208._0_4_);
        }
        iVar21 = (int)(float)local_230 + 1;
        local_230 = CONCAT44(local_230._4_4_,iVar21);
      } while (iVar21 < (int)uVar30);
    }
    lVar19 = local_60 * 4;
    glwViewport(*(int *)(local_f8 + lVar19) + local_19c,*(int *)(local_f8 + lVar19 + 4) + local_1a0,
                *(GLsizei *)(local_f8 + lVar19 + 8),*(GLsizei *)(local_f8 + lVar19 + 0xc));
    uVar2 = local_160._16_8_;
    iVar18 = *(int *)(local_f8 + lVar19 + 0x10);
    program = ((*(ShaderProgram **)(local_160._16_8_ + 0x88))->m_program).m_program;
    GVar11 = glwGetAttribLocation(program,"a_position");
    if (GVar11 != 0xffffffff) {
      glwEnableVertexAttribArray(GVar11);
      glwVertexAttribPointer(GVar11,2,0x1406,'\0',0,local_200.m_ptr);
    }
    GVar11 = glwGetAttribLocation(program,"a_texCoord");
    if (GVar11 != 0xffffffff) {
      glwEnableVertexAttribArray(GVar11);
      glwVertexAttribPointer(GVar11,2,0x1406,'\0',0,(void *)auStack_1e8._0_8_);
    }
    GVar12 = glwGetUniformLocation(program,"u_lod");
    if (GVar12 != -1) {
      glwUniform1f(GVar12,fVar31);
    }
    glwActiveTexture(0x84c0);
    glwBindTexture(0xde1,((Texture2D **)(uVar2 + 0x90))[iVar18]->m_glTexture);
    glwTexParameteri(0xde1,0x2802,*(deUint32 *)(uVar2 + 0x80));
    glwTexParameteri(0xde1,0x2803,*(deUint32 *)(uVar2 + 0x84));
    glwTexParameteri(0xde1,0x2801,*(deUint32 *)(uVar2 + 0x78));
    glwTexParameteri(0xde1,0x2800,*(deUint32 *)(uVar2 + 0x7c));
    GVar12 = glwGetUniformLocation(program,"u_texture");
    if (GVar12 != -1) {
      glwUniform1i(GVar12,0);
    }
    glwDrawElements(4,local_208._0_4_ * local_208._0_4_ * 6,0x1403,local_1d0.m_ptr);
    pTVar5 = ((Texture2D **)(uVar2 + 0x90))[*(int *)(local_f8 + lVar19 + 0x10)];
    glu::mapGLSampler((Sampler *)local_148,*(deUint32 *)(uVar2 + 0x80),*(deUint32 *)(uVar2 + 0x84),
                      *(deUint32 *)(uVar2 + 0x78),*(deUint32 *)(uVar2 + 0x7c));
    uVar6 = local_208._0_4_;
    uVar24 = (ulong)(uint)local_208._0_4_;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&local_220,(long)(int)(local_208._0_4_ * local_208._0_4_),(allocator_type *)local_160
              );
    if (0 < (int)uVar6) {
      lVar14 = 0;
      uVar30 = 0;
      do {
        uVar20 = 0;
        do {
          lVar16 = (long)(int)((local_208._0_4_ * uVar30 + (int)uVar20) * 4);
          tcu::sampleLevelArray2D
                    ((ConstPixelBufferAccess *)local_160,(int)(pTVar5->m_refTexture).m_view.m_levels
                     ,(Sampler *)(ulong)(uint)(pTVar5->m_refTexture).m_view.m_numLevels,
                     *(float *)(auStack_1e8._0_8_ + lVar16 * 8),
                     *(float *)(auStack_1e8._0_8_ + lVar16 * 8 + 4),(int)local_148,fVar31);
          *(ulong *)local_220.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[(int)uVar20 + (int)lVar14].m_data =
               CONCAT44(local_160._4_4_,local_160._0_4_);
          *(undefined8 *)
           (local_220.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[(int)uVar20 + (int)lVar14].m_data + 2) =
               local_160._8_8_;
          uVar20 = uVar20 + 1;
        } while (uVar24 != uVar20);
        uVar30 = uVar30 + 1;
        lVar14 = lVar14 + uVar24;
      } while (uVar30 != uVar6);
    }
    local_230 = (ulong)(int)local_208._0_4_;
    if (0 < (long)local_230) {
      iVar18 = *(int *)(local_f8 + lVar19 + 8);
      local_108 = (float)*(int *)(local_f8 + lVar19 + 0xc);
      fVar31 = 0.0;
      local_248 = 0;
      fStack_104 = local_108;
      fStack_100 = local_108;
      fStack_fc = local_108;
      do {
        uVar24 = 0;
        local_228 = fVar31;
        do {
          lVar14 = 0;
          do {
            *(float *)(local_160 + lVar14 * 4) =
                 local_220.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start[(int)fVar31].m_data[lVar14];
            lVar14 = lVar14 + 1;
          } while (lVar14 != 4);
          iVar21 = local_208._0_4_ * local_248 + (int)uVar24;
          uVar2 = *(undefined8 *)((long)local_200.m_ptr + (long)(iVar21 * 4) * 8);
          uVar3 = *(undefined8 *)((long)local_200.m_ptr + (long)(iVar21 * 4 + 3) * 8);
          local_1b8 = (float)uVar2 * 0.5 + 0.5;
          fStack_1b4 = (float)((ulong)uVar2 >> 0x20) * 0.5 + 0.5;
          fStack_1b0 = (float)uVar3 * 0.5 + 0.5;
          fStack_1ac = (float)((ulong)uVar3 >> 0x20) * 0.5 + 0.5;
          local_224 = fVar31;
          local_180 = uVar24;
          fVar31 = ceilf(local_1b8 * (float)iVar18 + -0.5);
          local_1a8 = CONCAT44(local_1a8._4_4_,fVar31);
          fVar32 = ceilf(fStack_1b0 * (float)iVar18 + -0.5);
          local_1b8 = fStack_1b4 * local_108 + -0.5;
          fStack_1b4 = fStack_1ac * fStack_104 + -0.5;
          fStack_1b0 = fStack_1b0 * fStack_100 + 0.0;
          fStack_1ac = fStack_1ac * fStack_fc + 0.0;
          local_198 = ceilf(local_1b8);
          fVar35 = ceilf(fStack_1b4);
          fVar31 = (float)(int)local_198;
          local_1b8 = (float)(int)fVar35;
          if ((int)fVar31 < (int)local_1b8) {
            iVar21 = (int)(float)local_1a8;
            local_198 = (float)((int)fVar32 - iVar21);
            do {
              if (iVar21 < (int)fVar32) {
                iVar27 = *(int *)(local_f8 + lVar19 + 4);
                iVar26 = *(int *)(local_f8 + lVar19) + iVar21;
                fVar35 = local_198;
                do {
                  tcu::RGBA::RGBA(&local_234,(Vec4 *)local_160);
                  *(deUint32 *)
                   ((long)local_58.m_pixels.m_ptr +
                   (long)(local_58.m_width * (iVar27 + (int)fVar31) + iVar26) * 4) =
                       local_234.m_value;
                  iVar26 = iVar26 + 1;
                  fVar35 = (float)((int)fVar35 + -1);
                } while (fVar35 != 0.0);
              }
              fVar31 = (float)((int)fVar31 + 1);
            } while (fVar31 != local_1b8);
          }
          uVar24 = local_180 + 1;
          fVar31 = (float)((int)local_224 + 1);
        } while (uVar24 != local_230);
        local_248 = local_248 + 1;
        fVar31 = (float)((int)local_228 + (int)local_230);
      } while (local_248 != (int)local_230);
    }
    if (local_220.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_220.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_220.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_220.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1d0.m_ptr != (void *)0x0) {
      operator_delete(local_1d0.m_ptr,(long)local_1c0 - (long)local_1d0.m_ptr);
    }
    this = (Vertex2DTextureCase *)local_160._16_8_;
    if ((void *)auStack_1e8._0_8_ != (void *)0x0) {
      operator_delete((void *)auStack_1e8._0_8_,sStack_1d8 - auStack_1e8._0_8_);
    }
    if (local_200.m_ptr != (void *)0x0) {
      operator_delete(local_200.m_ptr,(long)local_1f0 - (long)local_200.m_ptr);
    }
    lVar19 = local_68 + 1;
  } while (lVar19 != 4);
  tcu::Surface::Surface((Surface *)local_208,local_174,local_178);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  local_148._0_4_ = RGBA;
  local_148._4_4_ = UNORM_INT8;
  data = (void *)local_200.m_cap;
  if ((void *)local_200.m_cap != (void *)0x0) {
    data = local_200.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_f8,(TextureFormat *)local_148,local_208._0_4_,
             local_208._4_4_,1,data);
  glu::readPixels(context,local_19c,local_1a0,(PixelBufferAccess *)local_f8);
  glwUseProgram(0);
  bVar8 = compareImages(((this->super_TestCase).m_context)->m_renderCtx,
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                        &local_58,(Surface *)local_208);
  description = "Image comparison failed";
  if (bVar8) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar8,description
            );
  tcu::Surface::~Surface((Surface *)local_208);
  tcu::Surface::~Surface(&local_58);
  return STOP;
}

Assistant:

Vertex2DTextureCase::IterateResult Vertex2DTextureCase::iterate (void)
{
	const int	viewportWidth		= deMin32(m_context.getRenderTarget().getWidth(), MAX_2D_RENDER_WIDTH);
	const int	viewportHeight		= deMin32(m_context.getRenderTarget().getHeight(), MAX_2D_RENDER_HEIGHT);

	const int	viewportXOffsetMax	= m_context.getRenderTarget().getWidth() - viewportWidth;
	const int	viewportYOffsetMax	= m_context.getRenderTarget().getHeight() - viewportHeight;

	de::Random	rnd					(deStringHash(getName()));

	const int	viewportXOffset		= rnd.getInt(0, viewportXOffsetMax);
	const int	viewportYOffset		= rnd.getInt(0, viewportYOffsetMax);

	glUseProgram(m_program->getProgram());

	// Divide viewport into 4 cells.
	const int leftWidth		= viewportWidth / 2;
	const int rightWidth	= viewportWidth - leftWidth;
	const int bottomHeight	= viewportHeight / 2;
	const int topHeight		= viewportHeight - bottomHeight;

	// Clear.
	glClearColor(0.125f, 0.25f, 0.5f, 1.0f);
	glClear(GL_COLOR_BUFFER_BIT);

	// Texture scaling and offsetting vectors.
	const Vec2 texMinScale		(+1.8f, +1.8f);
	const Vec2 texMinOffset		(-0.3f, -0.2f);
	const Vec2 texMagScale		(+0.3f, +0.3f);
	const Vec2 texMagOffset		(+0.9f, +0.8f);

	// Surface for the reference image.
	tcu::Surface refImage(viewportWidth, viewportHeight);

	{
		const struct Render
		{
			const Rect	region;
			int			textureNdx;
			const Vec2	texCoordScale;
			const Vec2	texCoordOffset;
			Render (const Rect& r, int tN, const Vec2& tS, const Vec2& tO) : region(r), textureNdx(tN), texCoordScale(tS), texCoordOffset(tO) {}
		} renders[] =
		{
			Render(Rect(0,				0,				leftWidth,	bottomHeight),	0, texMinScale, texMinOffset),
			Render(Rect(leftWidth,		0,				rightWidth,	bottomHeight),	0, texMagScale, texMagOffset),
			Render(Rect(0,				bottomHeight,	leftWidth,	topHeight),		1, texMinScale, texMinOffset),
			Render(Rect(leftWidth,		bottomHeight,	rightWidth,	topHeight),		1, texMagScale, texMagOffset)
		};

		for (int renderNdx = 0; renderNdx < DE_LENGTH_OF_ARRAY(renders); renderNdx++)
		{
			const Render&	rend				= renders[renderNdx];
			const float		lod					= calculateLod(rend.texCoordScale, rend.region.size().asFloat(), rend.textureNdx);
			const bool		useSafeTexCoords	= isLevelNearest(lod > 0.0f ? m_minFilter : m_magFilter);
			const Grid		grid				(GRID_SIZE_2D, rend.region.size(), getTextureSize(*m_textures[rend.textureNdx]),
												 TexTypeCoordParams<TEXTURETYPE_2D>(rend.texCoordScale, rend.texCoordOffset), useSafeTexCoords);

			glViewport(viewportXOffset + rend.region.x, viewportYOffset + rend.region.y, rend.region.w, rend.region.h);
			renderCell				(rend.textureNdx, lod, grid);
			computeReferenceCell	(rend.textureNdx, lod, grid, refImage, rend.region);
		}
	}

	// Read back rendered results.
	tcu::Surface resImage(viewportWidth, viewportHeight);
	glu::readPixels(m_context.getRenderContext(), viewportXOffset, viewportYOffset, resImage.getAccess());

	glUseProgram(0);

	// Compare and log.
	{
		const bool isOk = compareImages(m_context.getRenderContext(), m_testCtx.getLog(), refImage, resImage);

		m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								isOk ? "Pass"				: "Image comparison failed");
	}

	return STOP;
}